

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O0

void duckdb::SetSelectionVector
               (SelectionVector *sel,data_ptr_t indices_p,LogicalType *logical_type,idx_t size,
               ValidityMask *mask,idx_t last_element_pos)

{
  LogicalTypeId LVar1;
  uint uVar2;
  undefined8 uVar3;
  SelectionVector *sel_00;
  LogicalType *in_RDX;
  long in_R8;
  data_ptr_t in_R9;
  LogicalType *in_stack_00000428;
  string *in_stack_fffffffffffffe18;
  ConversionException *in_stack_fffffffffffffe20;
  idx_t in_stack_fffffffffffffe28;
  allocator *paVar4;
  SelectionVector *in_stack_fffffffffffffe30;
  ValidityMask *in_stack_fffffffffffffe38;
  idx_t in_stack_fffffffffffffe40;
  data_ptr_t in_stack_fffffffffffffe48;
  SelectionVector *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  SelectionVector *in_stack_fffffffffffffe90;
  allocator local_129;
  string local_128 [39];
  undefined1 local_101;
  allocator local_d9;
  string local_d8 [38];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [35];
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  data_ptr_t local_30;
  long local_28;
  LogicalType *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  SelectionVector::Initialize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (local_28 == 0) {
    LVar1 = LogicalType::id(local_18);
    sel_00 = (SelectionVector *)(ulong)(byte)(LVar1 - TINYINT);
    switch(sel_00) {
    case (SelectionVector *)0x0:
      SetSelectionVectorLoop<signed_char>
                (sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case (SelectionVector *)0x1:
      SetSelectionVectorLoop<short>
                (sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case (SelectionVector *)0x2:
      SetSelectionVectorLoop<int>
                (sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case (SelectionVector *)0x3:
      uVar2 = NumericLimits<unsigned_int>::Maximum();
      if ((data_ptr_t)(ulong)uVar2 < local_30) {
        SetSelectionVectorLoopWithChecks<long>
                  (in_stack_fffffffffffffe90,(data_ptr_t)in_stack_fffffffffffffe88,
                   (idx_t)in_stack_fffffffffffffe80);
      }
      else {
        SetSelectionVectorLoop<long>(sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)local_30);
      }
      break;
    default:
      uVar3 = __cxa_allocate_exception(0x10);
      paVar4 = &local_129;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_128,"(Arrow) Unsupported type for selection vectors %s",paVar4);
      LogicalType::ToString_abi_cxx11_(in_stack_00000428);
      ConversionException::ConversionException<std::__cxx11::string>
                ((ConversionException *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80);
      __cxa_throw(uVar3,&ConversionException::typeinfo,ConversionException::~ConversionException);
    case (SelectionVector *)0x11:
      SetSelectionVectorLoop<unsigned_char>
                (sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case (SelectionVector *)0x12:
      SetSelectionVectorLoop<unsigned_short>
                (sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case (SelectionVector *)0x13:
      SetSelectionVectorLoop<unsigned_int>
                (sel_00,(data_ptr_t)in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case (SelectionVector *)0x14:
      uVar2 = NumericLimits<unsigned_int>::Maximum();
      if ((data_ptr_t)(ulong)uVar2 < local_30) {
        SetSelectionVectorLoopWithChecks<unsigned_long>
                  (in_stack_fffffffffffffe90,(data_ptr_t)in_stack_fffffffffffffe88,
                   (idx_t)in_stack_fffffffffffffe80);
      }
      else {
        SetSelectionVectorLoop<unsigned_long>(sel_00,local_30,(idx_t)in_stack_fffffffffffffe30);
      }
    }
  }
  else {
    LVar1 = LogicalType::id(local_18);
    switch(LVar1) {
    case TINYINT:
      SetMaskedSelectionVectorLoop<signed_char>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case SMALLINT:
      SetMaskedSelectionVectorLoop<short>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case INTEGER:
      SetMaskedSelectionVectorLoop<int>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case BIGINT:
      uVar2 = NumericLimits<unsigned_int>::Maximum();
      if ((data_ptr_t)(ulong)uVar2 < local_30) {
        local_b2 = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_b0,"DuckDB only supports indices that fit on an uint32",&local_b1);
        ConversionException::ConversionException
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_b2 = 0;
        __cxa_throw(uVar3,&ConversionException::typeinfo,ConversionException::~ConversionException);
      }
      SetMaskedSelectionVectorLoop<long>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    default:
      local_101 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      paVar4 = &local_d9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_d8,"(Arrow) Unsupported type for selection vectors %s",paVar4);
      LogicalType::ToString_abi_cxx11_(in_stack_00000428);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                ((NotImplementedException *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80);
      local_101 = 0;
      __cxa_throw(uVar3,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    case UTINYINT:
      SetMaskedSelectionVectorLoop<unsigned_char>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case USMALLINT:
      SetMaskedSelectionVectorLoop<unsigned_short>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case UINTEGER:
      uVar2 = NumericLimits<unsigned_int>::Maximum();
      if ((data_ptr_t)(ulong)uVar2 < local_30) {
        local_65 = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        paVar4 = &local_51;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_50,"DuckDB only supports indices that fit on an uint32",paVar4);
        ConversionException::ConversionException
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_65 = 0;
        __cxa_throw(uVar3,&ConversionException::typeinfo,ConversionException::~ConversionException);
      }
      SetMaskedSelectionVectorLoop<unsigned_int>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
      break;
    case UBIGINT:
      uVar2 = NumericLimits<unsigned_int>::Maximum();
      if ((data_ptr_t)(ulong)uVar2 < local_30) {
        local_8a = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_88,"DuckDB only supports indices that fit on an uint32",&local_89);
        ConversionException::ConversionException
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_8a = 0;
        __cxa_throw(uVar3,&ConversionException::typeinfo,ConversionException::~ConversionException);
      }
      SetMaskedSelectionVectorLoop<unsigned_long>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38,(idx_t)in_stack_fffffffffffffe30);
    }
  }
  return;
}

Assistant:

static void SetSelectionVector(SelectionVector &sel, data_ptr_t indices_p, const LogicalType &logical_type, idx_t size,
                               ValidityMask *mask = nullptr, idx_t last_element_pos = 0) {
	sel.Initialize(size);

	if (mask) {
		switch (logical_type.id()) {
		case LogicalTypeId::UTINYINT:
			SetMaskedSelectionVectorLoop<uint8_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::TINYINT:
			SetMaskedSelectionVectorLoop<int8_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::USMALLINT:
			SetMaskedSelectionVectorLoop<uint16_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::SMALLINT:
			SetMaskedSelectionVectorLoop<int16_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::UINTEGER:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<uint32_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::INTEGER:
			SetMaskedSelectionVectorLoop<int32_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::UBIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<uint64_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::BIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<int64_t>(sel, indices_p, size, *mask, last_element_pos);
			break;

		default:
			throw NotImplementedException("(Arrow) Unsupported type for selection vectors %s", logical_type.ToString());
		}

	} else {
		switch (logical_type.id()) {
		case LogicalTypeId::UTINYINT:
			SetSelectionVectorLoop<uint8_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::TINYINT:
			SetSelectionVectorLoop<int8_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::USMALLINT:
			SetSelectionVectorLoop<uint16_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::SMALLINT:
			SetSelectionVectorLoop<int16_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::UINTEGER:
			SetSelectionVectorLoop<uint32_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::INTEGER:
			SetSelectionVectorLoop<int32_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::UBIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! We need to check if our indexes fit in a uint32_t
				SetSelectionVectorLoopWithChecks<uint64_t>(sel, indices_p, size);
			} else {
				SetSelectionVectorLoop<uint64_t>(sel, indices_p, size);
			}
			break;
		case LogicalTypeId::BIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! We need to check if our indexes fit in a uint32_t
				SetSelectionVectorLoopWithChecks<int64_t>(sel, indices_p, size);
			} else {
				SetSelectionVectorLoop<int64_t>(sel, indices_p, size);
			}
			break;
		default:
			throw ConversionException("(Arrow) Unsupported type for selection vectors %s", logical_type.ToString());
		}
	}
}